

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_map.hpp
# Opt level: O0

iterator * __thiscall
skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
::find(iterator *__return_storage_ptr__,
      skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
      *this,int find_key)

{
  bool bVar1;
  reference ppSVar2;
  bool local_42;
  bool local_41;
  value_type local_20;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *follow;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  *psStack_10;
  int find_key_local;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  *this_local;
  
  follow._4_4_ = find_key;
  psStack_10 = this;
  bVar1 = std::
          vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
          ::empty(&this->key);
  if (bVar1) {
    end(__return_storage_ptr__,this);
  }
  else {
    ppSVar2 = std::
              vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ::back(&this->key);
    for (local_20 = *ppSVar2;
        local_20->down !=
        (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0; local_20 = local_20->down) {
      while( true ) {
        local_41 = false;
        if (local_20->next !=
            (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          local_41 = std::less<int>::operator()
                               ((less<int> *)&this->field_0xa00,&local_20->next->val,
                                (int *)((long)&follow + 4));
        }
        if (local_41 == false) break;
        local_20 = local_20->next;
      }
    }
    while( true ) {
      local_42 = false;
      if (local_20->next !=
          (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        local_42 = std::less<int>::operator()
                             ((less<int> *)&this->field_0xa00,&local_20->next->val,
                              (int *)((long)&follow + 4));
      }
      if (local_42 == false) break;
      local_20 = local_20->next;
    }
    if ((local_20->next ==
         (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0) ||
       (bVar1 = _420_is_equal<int,std::less<int>>(&local_20->next->val,(long)&follow + 4), !bVar1))
    {
      end(__return_storage_ptr__,this);
    }
    else {
      cake_iterator<false>::cake_iterator(__return_storage_ptr__,local_20->next);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename skiplist<T, V, X>::iterator skiplist<T, V, X>::find(T find_key) {
    // Same algorithm as erase, but without erasing anything ;)
    if(key.empty())
        return end();

    // Start from top left
    SLNode<T, V>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val, find_key))
            follow = follow->next;
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val, find_key))
        follow = follow->next;

    // If not exist, leave
    if(!follow->next || !_420_is_equal(follow->next->val, find_key, compare))
        return end();

    // This is the node for sure
    follow = follow->next;
    return iterator(follow);
}